

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_context.c
# Opt level: O1

EGLContext glfwGetEGLContext(GLFWwindow *handle)

{
  int error;
  
  if (_glfwInitialized == 0) {
    error = 0x10001;
  }
  else {
    if (*(int *)(handle + 0x1f0) != 0) {
      return *(EGLContext *)(handle + 0x280);
    }
    error = 0x1000a;
  }
  _glfwInputError(error,(char *)0x0);
  return (EGLContext)0x0;
}

Assistant:

GLFWAPI EGLContext glfwGetEGLContext(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    _GLFW_REQUIRE_INIT_OR_RETURN(EGL_NO_CONTEXT);

    if (window->context.client == GLFW_NO_API)
    {
        _glfwInputError(GLFW_NO_WINDOW_CONTEXT, NULL);
        return EGL_NO_CONTEXT;
    }

    return window->context.egl.handle;
}